

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Gecko::Graph::optimize(Graph *this,uint n)

{
  Progress *pPVar1;
  int iVar2;
  Subgraph *this_00;
  uint k;
  ulong uVar3;
  ulong uVar4;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream count;
  undefined8 auStack_188 [45];
  
  uVar3 = (long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start >> 2;
  uVar4 = uVar3 & 0xffffffff;
  if (n <= uVar3) {
    uVar4 = (ulong)n;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&count);
  *(undefined8 *)((long)auStack_188 + *(long *)(_count + -0x18)) = 2;
  std::ostream::_M_insert<unsigned_long>((ulong)&count);
  pPVar1 = this->progress;
  std::__cxx11::string::string((string *)&local_1d8,"perm",&local_1f9);
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1b8,&local_1d8,&local_1f8);
  (*pPVar1->_vptr_Progress[6])(pPVar1,this,&local_1b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  this_00 = (Subgraph *)operator_new(0x508);
  Subgraph::Subgraph(this_00,this,(uint)uVar4);
  for (uVar3 = 0;
      uVar3 <= ((long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) - uVar4;
      uVar3 = (ulong)((uint)uVar3 + 1)) {
    iVar2 = (*this->progress->_vptr_Progress[8])();
    if ((char)iVar2 != '\0') break;
    Subgraph::optimize(this_00,(uint)uVar3);
  }
  Subgraph::~Subgraph(this_00);
  operator_delete(this_00);
  (*this->progress->_vptr_Progress[7])(this->progress,this,1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&count);
  return;
}

Assistant:

void
Graph::optimize(uint n)
{
  if (n > perm.size())
    n = uint(perm.size());
  ostringstream count;
  count << setw(2) << n;
  progress->beginphase(this, string("perm") + count.str());
  Subgraph* subgraph = new Subgraph(this, n);
  for (uint k = 0; k <= perm.size() - n && !progress->quit(); k++)
    subgraph->optimize(k);
  delete subgraph;
  progress->endphase(this, true);
}